

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_conn.cc
# Opt level: O2

void __thiscall CSocekt::flyd_free_connection(CSocekt *this,lp_connection_t pConn)

{
  MutexLockGuard lock;
  MutexLockGuard local_20;
  lp_connection_t local_18;
  
  local_20.mutex_ = &this->m_connectionMutex;
  local_18 = pConn;
  muduo::MutexLock::lock(local_20.mutex_);
  flyd_connection_s::PutOneToFree(pConn);
  std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::push_back
            (&this->m_freeconnectionList,&local_18);
  LOCK();
  (this->m_free_connection_n).value_ = (this->m_free_connection_n).value_ + 1;
  UNLOCK();
  muduo::MutexLockGuard::~MutexLockGuard(&local_20);
  return;
}

Assistant:

void CSocekt::flyd_free_connection(lp_connection_t pConn)
{
    muduo::MutexLockGuard lock(m_connectionMutex);

    //首先明确一点，连接，所有连接全部都在m_connectionList里；
    pConn->PutOneToFree();

    //扔到空闲连接列表里
    m_freeconnectionList.push_back(pConn);

    //空闲连接数+1
    m_free_connection_n.increment();

    return;
}